

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-log.cpp
# Opt level: O2

int main(void)

{
  thread *this;
  pointer *__ptr;
  long lVar1;
  long *local_88;
  thread local_80;
  thread threads [8];
  
  this = threads;
  threads[6]._M_id._M_thread = (id)0;
  threads[7]._M_id._M_thread = (id)0;
  threads[4]._M_id._M_thread = (id)0;
  threads[5]._M_id._M_thread = (id)0;
  threads[2]._M_id._M_thread = (id)0;
  threads[3]._M_id._M_thread = (id)0;
  threads[0]._M_id._M_thread = (id)0;
  threads[1]._M_id._M_thread = (id)0;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    local_80._M_id._M_thread = (id)0;
    local_88 = (long *)operator_new(0x10);
    *local_88 = (long)&PTR___State_00106ca0;
    *(int *)(local_88 + 1) = (int)lVar1;
    std::thread::_M_start_thread(&local_80,&local_88,0);
    if (local_88 != (long *)0x0) {
      (**(code **)(*local_88 + 8))();
    }
    std::thread::operator=(this,&local_80);
    std::thread::~thread(&local_80);
    this = this + 1;
  }
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 8) {
    std::thread::join();
  }
  lVar1 = 0x38;
  do {
    std::thread::~thread((thread *)((long)&threads[0]._M_id._M_thread + lVar1));
    lVar1 = lVar1 + -8;
  } while (lVar1 != -8);
  return 0;
}

Assistant:

int main() {
    const int n_thread = 8;

    std::thread threads[n_thread];
    for (int i = 0; i < n_thread; i++) {
        threads[i] = std::thread([i]() {
            const int n_msg = 1000;

            for (int j = 0; j < n_msg; j++) {
                const int log_type = std::rand() % 4;

                switch (log_type) {
                    case 0: LOG_INF("Thread %d: %d\n", i, j); break;
                    case 1: LOG_WRN("Thread %d: %d\n", i, j); break;
                    case 2: LOG_ERR("Thread %d: %d\n", i, j); break;
                    case 3: LOG_DBG("Thread %d: %d\n", i, j); break;
                    default:
                        break;
                }

                if (rand () % 10 < 5) {
                    common_log_set_timestamps(common_log_main(), rand() % 2);
                    common_log_set_prefix    (common_log_main(), rand() % 2);
                }
            }
        });
    }

    for (int i = 0; i < n_thread; i++) {
        threads[i].join();
    }

    return 0;
}